

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

void __thiscall cmCMakePresetsGraph::PrintAllPresets(cmCMakePresetsGraph *this)

{
  PrintPrecedingNewline *newline_00;
  uint in_EAX;
  PrintPrecedingNewline newline;
  undefined8 uStack_18;
  
  newline_00 = (PrintPrecedingNewline *)((long)&uStack_18 + 4);
  uStack_18 = (ulong)in_EAX;
  PrintConfigurePresetList(this,newline_00);
  PrintBuildPresetList(this,newline_00);
  PrintTestPresetList(this,newline_00);
  PrintPackagePresetList(this,newline_00);
  PrintWorkflowPresetList(this,newline_00);
  return;
}

Assistant:

void cmCMakePresetsGraph::PrintAllPresets() const
{
  PrintPrecedingNewline newline = PrintPrecedingNewline::False;
  this->PrintConfigurePresetList(&newline);
  this->PrintBuildPresetList(&newline);
  this->PrintTestPresetList(&newline);
  this->PrintPackagePresetList(&newline);
  this->PrintWorkflowPresetList(&newline);
}